

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_Encode
               (CLzmaEncHandle pp,ISeqOutStream *outStream,ISeqInStream *inStream,
               ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  SRes SVar1;
  ISeqInStream *in_RCX;
  CLzmaEncHandle in_RDX;
  ISzAlloc *in_RDI;
  ISeqOutStream *in_R8;
  ISzAlloc *in_R9;
  int __result__;
  SRes res;
  CLzmaEnc *p;
  SRes local_44;
  ISzAlloc *pIVar2;
  SRes local_4;
  
  pIVar2 = in_RDI;
  local_4 = LzmaEnc_Prepare(in_RDX,in_RCX,in_R8,in_R9,in_RDI);
  if (local_4 == 0) {
    do {
      local_44 = LzmaEnc_CodeOneBlock
                           ((CLzmaEnc *)inStream,progress._4_4_,(UInt32)progress,alloc._4_4_);
      if ((local_44 != 0) || (*(int *)((long)&pIVar2[0x3d34].Alloc + 4) != 0)) goto LAB_0023ba29;
    } while ((in_RCX == (ISeqInStream *)0x0) ||
            (SVar1 = (*in_RCX->Read)(in_RCX,pIVar2[0x3d33].Free,
                                     (size_t *)
                                     (pIVar2[0x3d2f].Free +
                                     (long)(pIVar2[0x3d32].Alloc +
                                           ((long)pIVar2[0x3d30].Alloc - (long)pIVar2[0x3d31].Alloc)
                                           ))), SVar1 == 0));
    local_44 = 10;
LAB_0023ba29:
    LzmaEnc_Finish(in_RDI);
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

SRes LzmaEnc_Encode(CLzmaEncHandle pp, ISeqOutStream* outStream, ISeqInStream* inStream, ICompressProgress* progress,
                    ISzAlloc* alloc, ISzAlloc* allocBig) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  SRes res = SZ_OK;

#ifdef COMPRESS_MF_MT
  Byte allocaDummy[0x300];
  (void)allocaDummy;
  int i = 0;
  for (i = 0; i < 16; i++)
    allocaDummy[i] = (Byte)i;
#endif

  RINOK(LzmaEnc_Prepare(pp, inStream, outStream, alloc, allocBig));

  for (;;) {
    res = LzmaEnc_CodeOneBlock(p, False, 0, 0);
    if (res != SZ_OK || p->finished != 0)
      break;
    if (progress != 0) {
      res = progress->Progress(progress, p->nowPos64, RangeEnc_GetProcessed(&p->rc));
      if (res != SZ_OK) {
        res = SZ_ERROR_PROGRESS;
        break;
      }
    }
  }
  LzmaEnc_Finish(pp);
  return res;
}